

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimMv.c
# Opt level: O3

Saig_MvObj_t * Saig_ManCreateReducedAig(Aig_Man_t *p,Vec_Ptr_t **pvFlops)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Saig_MvObj_t *pSVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  Saig_MvObj_t *pSVar11;
  
  iVar1 = p->nRegs;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  iVar7 = 8;
  if (6 < iVar1 - 1U) {
    iVar7 = iVar1;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar7;
  if (iVar7 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)iVar7 << 3);
  }
  pVVar4->pArray = ppvVar5;
  *pvFlops = pVVar4;
  pVVar4 = p->vObjs;
  lVar9 = (long)pVVar4->nSize;
  pSVar6 = (Saig_MvObj_t *)calloc(lVar9 + 1,0xc);
  if (0 < lVar9) {
    lVar10 = 0;
    pSVar11 = pSVar6;
    do {
      piVar2 = (int *)pVVar4->pArray[lVar10];
      if (piVar2 != (int *)0x0) {
        *(uint *)&pSVar11->field_0x8 = *(uint *)&pSVar11->field_0x8 & 0xfffffff8 | piVar2[6] & 7U;
        uVar8 = (uint)*(undefined8 *)(piVar2 + 6) & 7;
        if ((lVar10 == 0) || (uVar8 == 2)) {
          if ((uVar8 == 2) && (p->nTruePis <= *piVar2)) {
            uVar8 = (*piVar2 - p->nTruePis) + p->nTruePos;
            if (((int)uVar8 < 0) || (p->vCos->nSize <= (int)uVar8)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pSVar11->iFan0 = *(int *)((long)p->vCos->pArray[uVar8] + 0x24) * 2;
            pSVar11->iFan1 = -1;
            pVVar4 = *pvFlops;
            uVar8 = pVVar4->nSize;
            if (uVar8 == pVVar4->nCap) {
              if ((int)uVar8 < 0x10) {
                if (pVVar4->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc(0x80);
                }
                else {
                  ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
                }
                pVVar4->pArray = ppvVar5;
                pVVar4->nCap = 0x10;
              }
              else {
                if (pVVar4->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc((ulong)uVar8 << 4);
                }
                else {
                  ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar8 << 4);
                }
                pVVar4->pArray = ppvVar5;
                pVVar4->nCap = uVar8 * 2;
              }
            }
            else {
              ppvVar5 = pVVar4->pArray;
            }
            iVar1 = pVVar4->nSize;
            pVVar4->nSize = iVar1 + 1;
            ppvVar5[iVar1] = pSVar11;
            pVVar4 = p->vObjs;
          }
        }
        else {
          uVar3 = *(ulong *)(piVar2 + 2);
          if (uVar3 == 0) {
            uVar8 = 0xfffffffe;
          }
          else {
            uVar8 = *(int *)((uVar3 & 0xfffffffffffffffe) + 0x24) * 2;
          }
          pSVar11->iFan0 = (uint)uVar3 & 1 | uVar8;
          if (((uint)*(undefined8 *)(piVar2 + 6) & 7) != 3) {
            if (((uint)*(undefined8 *)(piVar2 + 6) & 7) - 7 < 0xfffffffe) {
              __assert_fail("Aig_ObjIsNode(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigSimMv.c"
                            ,0x9a,
                            "Saig_MvObj_t *Saig_ManCreateReducedAig(Aig_Man_t *, Vec_Ptr_t **)");
            }
            uVar3 = *(ulong *)(piVar2 + 4);
            if (uVar3 == 0) {
              uVar8 = 0xfffffffe;
            }
            else {
              uVar8 = *(int *)((uVar3 & 0xfffffffffffffffe) + 0x24) * 2;
            }
            pSVar11->iFan1 = (uint)uVar3 & 1 | uVar8;
          }
        }
      }
      lVar10 = lVar10 + 1;
      lVar9 = (long)pVVar4->nSize;
      pSVar11 = pSVar11 + 1;
    } while (lVar10 < lVar9);
  }
  pSVar6[lVar9].field_0x8 = pSVar6[lVar9].field_0x8 | 7;
  return pSVar6;
}

Assistant:

Saig_MvObj_t * Saig_ManCreateReducedAig( Aig_Man_t * p, Vec_Ptr_t ** pvFlops )
{
    Saig_MvObj_t * pAig, * pEntry;
    Aig_Obj_t * pObj;
    int i;
    *pvFlops = Vec_PtrAlloc( Aig_ManRegNum(p) );
    pAig = ABC_CALLOC( Saig_MvObj_t, Aig_ManObjNumMax(p)+1 );
    Aig_ManForEachObj( p, pObj, i )
    {
        pEntry = pAig + i;
        pEntry->Type = pObj->Type;
        if ( Aig_ObjIsCi(pObj) || i == 0 )
        {
            if ( Saig_ObjIsLo(p, pObj) )
            {
                pEntry->iFan0 = (Saig_ObjLoToLi(p, pObj)->Id << 1);
                pEntry->iFan1 = -1;
                Vec_PtrPush( *pvFlops, pEntry );
            }
            continue;
        }
        pEntry->iFan0 = (Aig_ObjFaninId0(pObj) << 1) | Aig_ObjFaninC0(pObj);
        if ( Aig_ObjIsCo(pObj) )
            continue;
        assert( Aig_ObjIsNode(pObj) );
        pEntry->iFan1 = (Aig_ObjFaninId1(pObj) << 1) | Aig_ObjFaninC1(pObj);
    }
    pEntry = pAig + Aig_ManObjNumMax(p);
    pEntry->Type = AIG_OBJ_VOID;
    return pAig;
}